

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::NavierStokesBase
          (NavierStokesBase *this,Amr *papa,int lev,Geometry *level_geom,BoxArray *bl,
          DistributionMapping *dm,Real time)

{
  DistributionMapping *pDVar1;
  BoxArray *bxs;
  IntVect *ref_ratio;
  int iVar2;
  pointer pSVar3;
  Amr *pAVar4;
  SyncRegister *this_00;
  FluxRegister *pFVar5;
  Projection *this_01;
  Diffusion *this_02;
  NavierStokesBase *pNVar6;
  MultiFab *pMVar7;
  MacProj *this_03;
  Diffusion *Coarser;
  char *this_04;
  long lVar8;
  int n;
  MFInfo local_108;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_e0;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_d8;
  MultiFab *local_d0;
  MultiFab *local_c8;
  PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_c0;
  PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_b8;
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  *local_b0;
  MultiFab *local_a8;
  MultiFab *local_a0;
  MultiFab *local_98;
  BoxArray *local_90;
  MultiFab *local_88;
  MultiFab *local_80;
  FabArray<amrex::BaseFab<int>_> *local_78;
  MultiFab *local_70;
  DistributionMapping *local_68;
  vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_60;
  vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_48;
  
  local_68 = dm;
  amrex::AmrLevel::AmrLevel(&this->super_AmrLevel,papa,lev,level_geom,bl,dm,time);
  (this->super_AmrLevel)._vptr_AmrLevel = (_func_int **)&PTR__NavierStokesBase_0074f2c8;
  local_70 = &this->volume;
  amrex::MultiFab::MultiFab(local_70);
  lVar8 = 0x540;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)((long)(this->super_AmrLevel).geom.super_CoordSys.offset + lVar8 + -0x18)
              );
    lVar8 = lVar8 + 0x180;
  } while (lVar8 != 0x9c0);
  local_78 = &this->ebmask;
  amrex::FabArray<amrex::BaseFab<int>_>::FabArray(local_78);
  local_d8 = &this->m_bcrec_velocity;
  local_e0 = &this->m_bcrec_scalars;
  local_b8 = &this->m_bcrec_velocity_d;
  local_c0 = &this->m_bcrec_scalars_d;
  local_c8 = &this->rho_avg;
  (this->m_bcrec_scalars_d).m_size = 0;
  (this->m_bcrec_scalars_d).m_capacity = 0;
  (this->m_bcrec_velocity_d).m_capacity = 0;
  (this->m_bcrec_scalars_d).m_data = (pointer)0x0;
  (this->m_bcrec_velocity_d).m_data = (pointer)0x0;
  (this->m_bcrec_velocity_d).m_size = 0;
  (this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  amrex::MultiFab::MultiFab(local_c8);
  local_d0 = &this->p_avg;
  amrex::MultiFab::MultiFab(local_d0);
  local_80 = &this->Vsync;
  amrex::MultiFab::MultiFab(local_80);
  local_88 = &this->Ssync;
  amrex::MultiFab::MultiFab(local_88);
  local_98 = &this->rho_half;
  amrex::MultiFab::MultiFab(local_98);
  local_a0 = &this->rho_ptime;
  amrex::MultiFab::MultiFab(local_a0);
  local_a8 = &this->rho_ctime;
  amrex::MultiFab::MultiFab(local_a8);
  local_b0 = &this->radius;
  (this->radius).
  super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  .
  super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->radius).
  super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  .
  super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->radius).
  super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  .
  super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_04 = (char *)&this->old_intersect_new;
  local_90 = (BoxArray *)this_04;
  amrex::BoxArray::BoxArray((BoxArray *)this_04);
  if ((level_geom->super_CoordSys).c_sys == RZ) {
    this_04 = "Embedded boundaries with RZ geometry is not currently suppported.";
    amrex::Abort_host("Embedded boundaries with RZ geometry is not currently suppported.");
    lVar8 = 0;
    do {
      if (0.0 < visc_coef.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar8]) {
        this_04 = 
        "RZ geometry with viscosity is not currently supported. To use set ns.vel_visc_coef=0";
        amrex::Abort_host(
                         "RZ geometry with viscosity is not currently supported. To use set ns.vel_visc_coef=0"
                         );
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  if (additional_state_types_initialized == 0) {
    init_additional_state_types((NavierStokesBase *)this_04);
  }
  pSVar3 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  amrex::StateData::allocOldData(pSVar3 + 1);
  amrex::StateData::allocOldData
            ((this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start + 2);
  if (0 < (this->super_AmrLevel).level) {
    pDVar1 = &(this->super_AmrLevel).dmap;
    local_108._0_8_ = (pointer)0x1;
    local_108.arena = (Arena *)0x0;
    local_108.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::define
              (local_c8,&(this->super_AmrLevel).grids,pDVar1,1,1,&local_108,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    local_108._0_8_ = (pointer)0x1;
    local_108.arena = (Arena *)0x0;
    local_108.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::define
              (local_d0,&pSVar3[1].grids,pDVar1,1,0,&local_108,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  bxs = &(this->super_AmrLevel).grids;
  pDVar1 = &(this->super_AmrLevel).dmap;
  local_108._0_8_ = (pointer)0x1;
  local_108.arena = (Arena *)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::define
            (local_98,bxs,pDVar1,1,1,&local_108,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  local_108._0_8_ = (pointer)0x1;
  local_108.arena = (Arena *)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::define
            (local_a0,bxs,pDVar1,1,1,&local_108,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  local_108._0_8_ = (pointer)0x1;
  local_108.arena = (Arena *)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::define
            (local_a8,bxs,pDVar1,1,1,&local_108,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  this->rho_qtime = (MultiFab *)0x0;
  this->rho_tqtime = (MultiFab *)0x0;
  buildMetrics(this);
  init_eb(this,level_geom,bl,local_68);
  this->sync_reg = (SyncRegister *)0x0;
  if ((0 < (this->super_AmrLevel).level) && (do_sync_proj != 0)) {
    this_00 = (SyncRegister *)operator_new(0x1280);
    SyncRegister::SyncRegister(this_00,bxs,pDVar1,&(this->super_AmrLevel).crse_ratio);
    this->sync_reg = this_00;
  }
  this->advflux_reg = (FluxRegister *)0x0;
  this->viscflux_reg = (FluxRegister *)0x0;
  iVar2 = (this->super_AmrLevel).level;
  if ((0 < iVar2) && (do_reflux != 0)) {
    pFVar5 = (FluxRegister *)operator_new(0x988);
    ref_ratio = &(this->super_AmrLevel).crse_ratio;
    amrex::FluxRegister::FluxRegister(pFVar5,bxs,pDVar1,ref_ratio,iVar2,NUM_STATE);
    this->advflux_reg = pFVar5;
    pFVar5 = (FluxRegister *)operator_new(0x988);
    amrex::FluxRegister::FluxRegister
              (pFVar5,bxs,pDVar1,ref_ratio,(this->super_AmrLevel).level,NUM_STATE);
    this->viscflux_reg = pFVar5;
  }
  this->u_mac = (MultiFab *)0x0;
  this->aofs = (MultiFab *)0x0;
  if (projector == (Projection *)0x0) {
    this_01 = (Projection *)operator_new(0x68);
    pAVar4 = (this->super_AmrLevel).parent;
    Projection::Projection
              (this_01,pAVar4,&phys_bc,do_sync_proj,
               *(int *)&(pAVar4->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,radius_grow);
    projector = this_01;
  }
  Projection::install_level(projector,(this->super_AmrLevel).level,&this->super_AmrLevel,local_b0);
  this_02 = (Diffusion *)operator_new(0x50);
  pAVar4 = (this->super_AmrLevel).parent;
  iVar2 = (this->super_AmrLevel).level;
  if (iVar2 < 1) {
    Coarser = (Diffusion *)0x0;
  }
  else {
    pNVar6 = getLevel(this,iVar2 + -1);
    Coarser = pNVar6->diffusion;
  }
  Diffusion::Diffusion(this_02,pAVar4,this,Coarser,NUM_STATE,this->viscflux_reg,&is_diffusive);
  this->diffusion = this_02;
  pMVar7 = (MultiFab *)operator_new(0x180);
  local_108._0_8_ = (pointer)0x1;
  local_108.arena = (Arena *)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (pMVar7,bxs,pDVar1,NUM_STATE + -4,1,&local_108,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  this->diffn_cc = pMVar7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  pMVar7 = (MultiFab *)operator_new(0x180);
  local_108._0_8_ = (pointer)0x1;
  local_108.arena = (Arena *)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (pMVar7,bxs,pDVar1,NUM_STATE + -4,1,&local_108,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  this->diffnp1_cc = pMVar7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  pMVar7 = (MultiFab *)operator_new(0x180);
  local_108._0_8_ = (pointer)0x1;
  local_108.arena = (Arena *)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (pMVar7,bxs,pDVar1,1,1,&local_108,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  this->viscn_cc = pMVar7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  pMVar7 = (MultiFab *)operator_new(0x180);
  local_108._0_8_ = (pointer)0x1;
  local_108.arena = (Arena *)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (pMVar7,bxs,pDVar1,1,1,&local_108,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  this->viscnp1_cc = pMVar7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if (mac_projector == (MacProj *)0x0) {
    this_03 = (MacProj *)operator_new(0x60);
    pAVar4 = (this->super_AmrLevel).parent;
    MacProj::MacProj(this_03,pAVar4,
                     *(int *)&(pAVar4->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
                     &phys_bc,radius_grow);
    mac_projector = this_03;
  }
  MacProj::install_level(mac_projector,(this->super_AmrLevel).level,&this->super_AmrLevel);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            (&local_d8->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,3);
  fetchBCArray((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&local_108,this,0,0,3);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::_M_move_assign
            (&local_d8->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,&local_108);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,
                    (long)local_108.tags.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - local_108._0_8_);
  }
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize(local_b8,3);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&local_48,&local_d8->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
  amrex::convertToDeviceVector<amrex::BCRec>
            ((DeviceVector<amrex::BCRec> *)&local_108,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&local_48);
  operator_delete((this->m_bcrec_velocity_d).m_data,(this->m_bcrec_velocity_d).m_capacity * 0x18);
  (this->m_bcrec_velocity_d).m_data = (pointer)local_108._0_8_;
  (this->m_bcrec_velocity_d).m_size = (size_type)local_108.arena;
  (this->m_bcrec_velocity_d).m_capacity =
       (size_type)
       local_108.tags.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_108._0_8_ = (pointer)0x0;
  local_108.arena = (Arena *)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_48.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            (&local_e0->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,(long)NUM_SCALARS)
  ;
  fetchBCArray((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&local_108,this,0,3,
               NUM_SCALARS);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::_M_move_assign
            (&local_e0->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,&local_108);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,
                    (long)local_108.tags.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - local_108._0_8_);
  }
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize(local_c0,(long)NUM_SCALARS);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&local_60,&local_e0->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
  amrex::convertToDeviceVector<amrex::BCRec>
            ((DeviceVector<amrex::BCRec> *)&local_108,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&local_60);
  operator_delete((this->m_bcrec_scalars_d).m_data,(this->m_bcrec_scalars_d).m_capacity * 0x18);
  (this->m_bcrec_scalars_d).m_data = (pointer)local_108._0_8_;
  (this->m_bcrec_scalars_d).m_size = (size_type)local_108.arena;
  (this->m_bcrec_scalars_d).m_capacity =
       (size_type)
       local_108.tags.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_108._0_8_ = (pointer)0x0;
  local_108.arena = (Arena *)0x0;
  local_108.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_60.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

NavierStokesBase::NavierStokesBase (Amr&            papa,
                                    int             lev,
                                    const Geometry& level_geom,
                                    const BoxArray& bl,
                                    const DistributionMapping& dm,
                                    Real            time)
    :
    AmrLevel(papa,lev,level_geom,bl,dm,time)
{

    //
    // 2/2022 - Only allow RZ if there's no visc.
    //   MLMG Tensor solver does not currently support RZ
    //
    if ( level_geom.IsRZ() )
    {
#ifdef AMREX_USE_EB
      amrex::Abort("Embedded boundaries with RZ geometry is not currently suppported.");
#endif
        for ( int n = 0; n < AMREX_SPACEDIM; n++ ) {
            if ( visc_coef[n] > 0 ) {
                amrex::Abort("RZ geometry with viscosity is not currently supported. To use set ns.vel_visc_coef=0");
            }
        }
    }

    if(!additional_state_types_initialized) {
        init_additional_state_types();
    }

    const BoxArray& P_grids = state[Press_Type].boxArray();
    //
    // Alloc old_time pressure.
    //
    state[Press_Type].allocOldData();
    state[Gradp_Type].allocOldData();
    //
    // Alloc space for density and temporary pressure variables.
    //
    if (level > 0)
    {
        rho_avg.define(grids,dmap,1,1,MFInfo(),Factory());
        p_avg.define(P_grids,dmap,1,0,MFInfo(),Factory());
    }

    // FIXME -
    // rho_half is passed into level_project to be used as sigma in the MLMG
    // solve, but MLMG doesn't copy any ghost cells, it fills what it needs itself.
    // does rho_half still need any ghost cells?
    //
    // Also, don't really need rho_ptime, only rho_half uses it.
    // rho_ctime is used in PeleLM (there are other options though), and rho_half.
    rho_half.define (grids,dmap,1,1,MFInfo(),Factory());
    rho_ptime.define(grids,dmap,1,1,MFInfo(),Factory());
    rho_ctime.define(grids,dmap,1,1,MFInfo(),Factory());
    rho_qtime  = nullptr;
    rho_tqtime = nullptr;
    //
    // Build metric coefficients for RZ calculations.
    // Build volume and areas.
    //
    buildMetrics();


#ifdef AMREX_USE_EB
    init_eb(level_geom, bl, dm);
#endif

    //FIXME --- this fn is really similar to restart()... work on that later

    //
    // Set up reflux registers.
    //
    sync_reg = nullptr;
    if (level > 0 && do_sync_proj)
    {
        sync_reg = new SyncRegister(grids,dmap,crse_ratio);
    }
    advflux_reg  = nullptr;
    viscflux_reg = nullptr;
    if (level > 0 && do_reflux)
    {
        advflux_reg  = new FluxRegister(grids,dmap,crse_ratio,level,NUM_STATE);
        viscflux_reg = new FluxRegister(grids,dmap,crse_ratio,level,NUM_STATE);
    }
    //
    // Initialize work multifabs.
    //
    u_mac   = nullptr;
    aofs    = nullptr;

    //
    // Set up the level projector.
    //
    if (projector == nullptr)
    {
        projector = new Projection(parent,&phys_bc,do_sync_proj,
                                   parent->finestLevel(),radius_grow);
    }
    projector->install_level(level,this,&radius);

    //
    // Set up diffusion.
    //
    diffusion = new Diffusion(parent,this,
                              (level > 0) ? getLevel(level-1).diffusion : nullptr,
                              NUM_STATE,viscflux_reg,is_diffusive);
    //
    // Allocate the storage for variable viscosity and diffusivity
    //
    diffn_cc = new MultiFab(grids, dmap, NUM_STATE-Density-1, 1, MFInfo(), Factory());
    diffnp1_cc = new MultiFab(grids, dmap, NUM_STATE-Density-1, 1, MFInfo(), Factory());
    viscn_cc = new MultiFab(grids, dmap, 1, 1, MFInfo(), Factory());
    viscnp1_cc = new MultiFab(grids, dmap, 1, 1, MFInfo(), Factory());

    //
    // Set up the mac projector.
    //
    if (mac_projector == nullptr)
    {
        mac_projector = new MacProj(parent,parent->finestLevel(),
                                    &phys_bc,radius_grow);
    }
    mac_projector->install_level(level,this);

    //
    // Initialize BCRec for use with advection
    //
    m_bcrec_velocity.resize(AMREX_SPACEDIM);
    m_bcrec_velocity = fetchBCArray(State_Type,Xvel,AMREX_SPACEDIM);

    m_bcrec_velocity_d.resize(AMREX_SPACEDIM);
    m_bcrec_velocity_d = convertToDeviceVector(m_bcrec_velocity);

    m_bcrec_scalars.resize(NUM_SCALARS);
    m_bcrec_scalars = fetchBCArray(State_Type,Density,NUM_SCALARS);

    m_bcrec_scalars_d.resize(NUM_SCALARS);
    m_bcrec_scalars_d = convertToDeviceVector(m_bcrec_scalars);
}